

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O1

XMLCh * __thiscall
xercesc_4_0::DOMNodeImpl::lookupNamespaceURI(DOMNodeImpl *this,XMLCh *specifiedPrefix)

{
  XMLCh XVar1;
  short sVar2;
  short sVar3;
  XMLCh XVar4;
  int iVar5;
  undefined4 extraout_var;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  DOMNodeImpl *pDVar8;
  ulong uVar9;
  DOMNodeImpl *pDVar10;
  undefined2 *puVar11;
  undefined4 extraout_var_06;
  undefined2 *puVar12;
  long lVar13;
  short *psVar14;
  XMLCh *pXVar15;
  DOMNode *pDVar16;
  undefined4 extraout_var_10;
  short *psVar17;
  XMLCh *pXVar18;
  ulong uVar19;
  DOMNodeImpl *currentNode;
  DOMNodeImpl *this_00;
  bool bVar20;
  bool bVar21;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  
  currentNode = (DOMNodeImpl *)this->fContainingNode;
  this_00 = currentNode;
  iVar5 = (*(code *)currentNode->fContainingNode[4]._vptr_DOMNode)();
  switch((short)iVar5) {
  case 1:
    iVar5 = (*(code *)currentNode->fContainingNode[0x16]._vptr_DOMNode)(currentNode);
    pXVar6 = (XMLCh *)CONCAT44(extraout_var_00,iVar5);
    iVar5 = (*(code *)currentNode->fContainingNode[0x17]._vptr_DOMNode)(currentNode);
    pXVar7 = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
    if (pXVar6 != (XMLCh *)0x0) {
      if (specifiedPrefix == (XMLCh *)0x0 && pXVar7 == (XMLCh *)0x0) {
        return pXVar6;
      }
      if (pXVar7 != (XMLCh *)0x0) {
        if (pXVar7 == specifiedPrefix) {
          return pXVar6;
        }
        pXVar15 = pXVar7;
        pXVar18 = specifiedPrefix;
        if (specifiedPrefix == (XMLCh *)0x0) {
LAB_0027abd1:
          if (*pXVar7 == L'\0') {
            return pXVar6;
          }
        }
        else {
          do {
            pXVar7 = pXVar18;
            XVar1 = *pXVar15;
            if (XVar1 == L'\0') goto LAB_0027abd1;
            pXVar15 = pXVar15 + 1;
            pXVar18 = pXVar7 + 1;
          } while (XVar1 == *pXVar7);
        }
      }
    }
    this_00 = currentNode;
    iVar5 = (*(code *)currentNode->fContainingNode[0x1a]._vptr_DOMNode)();
    if ((char)iVar5 != '\0') {
      this_00 = currentNode;
      iVar5 = (*(code *)currentNode->fContainingNode[0xb]._vptr_DOMNode)();
      pDVar8 = (DOMNodeImpl *)CONCAT44(extraout_var_02,iVar5);
      if (pDVar8 == (DOMNodeImpl *)0x0) {
        bVar20 = true;
      }
      else {
        this_00 = pDVar8;
        iVar5 = (*(code *)pDVar8->fContainingNode[5]._vptr_DOMNode)();
        uVar9 = CONCAT44(extraout_var_03,iVar5);
        bVar20 = uVar9 == 0;
        if (!bVar20) {
          uVar19 = 0;
          pXVar7 = pXVar6;
          do {
            iVar5 = (*(code *)pDVar8->fContainingNode[3]._vptr_DOMNode)(pDVar8,uVar19);
            pDVar10 = (DOMNodeImpl *)CONCAT44(extraout_var_04,iVar5);
            iVar5 = (*(code *)pDVar10->fContainingNode[0x17]._vptr_DOMNode)(pDVar10);
            puVar11 = (undefined2 *)CONCAT44(extraout_var_05,iVar5);
            iVar5 = (*(code *)pDVar10->fContainingNode[3]._vptr_DOMNode)(pDVar10);
            pXVar6 = (XMLCh *)CONCAT44(extraout_var_06,iVar5);
            iVar5 = (*(code *)pDVar10->fContainingNode[0x16]._vptr_DOMNode)(pDVar10);
            puVar12 = (undefined2 *)CONCAT44(extraout_var_07,iVar5);
            this_00 = (DOMNodeImpl *)&XMLUni::fgXMLNSURIName;
            if (puVar12 == (undefined2 *)0x0) {
LAB_0027ad9b:
              bVar21 = true;
              pXVar6 = pXVar7;
            }
            else {
              if (puVar12 != &XMLUni::fgXMLNSURIName) {
                lVar13 = 0;
                do {
                  psVar14 = (short *)((long)puVar12 + lVar13);
                  if (*psVar14 == 0) {
                    if (*(short *)((long)&XMLUni::fgXMLNSURIName + lVar13) == 0) goto LAB_0027aca8;
                    break;
                  }
                  psVar17 = (short *)((long)&XMLUni::fgXMLNSURIName + lVar13);
                  lVar13 = lVar13 + 2;
                } while (*psVar14 == *psVar17);
                goto LAB_0027ad9b;
              }
LAB_0027aca8:
              if (specifiedPrefix != (XMLCh *)0x0) {
LAB_0027acad:
                if (puVar11 != (undefined2 *)0x0) {
                  if (puVar11 == &XMLUni::fgXMLNSString) {
LAB_0027ad29:
                    iVar5 = (*(code *)pDVar10->fContainingNode[0x18]._vptr_DOMNode)();
                    pXVar15 = (XMLCh *)CONCAT44(extraout_var_09,iVar5);
                    this_00 = pDVar10;
                    if (pXVar15 == specifiedPrefix) goto LAB_0027ad92;
                    pXVar18 = specifiedPrefix;
                    if ((specifiedPrefix != (XMLCh *)0x0) && (pXVar15 != (XMLCh *)0x0)) {
                      do {
                        XVar1 = *pXVar15;
                        if (XVar1 == L'\0') goto LAB_0027ad87;
                        pXVar15 = pXVar15 + 1;
                        XVar4 = *pXVar18;
                        pXVar18 = pXVar18 + 1;
                      } while (XVar1 == XVar4);
                      goto LAB_0027ad9b;
                    }
                    if (pXVar15 == (XMLCh *)0x0) {
                      if (specifiedPrefix == (XMLCh *)0x0) goto LAB_0027ad92;
LAB_0027ad87:
                      bVar21 = *pXVar18 == L'\0';
                    }
                    else {
                      bVar21 = *pXVar15 == L'\0';
                      if ((specifiedPrefix != (XMLCh *)0x0) && (*pXVar15 == L'\0'))
                      goto LAB_0027ad87;
                    }
                    if (bVar21) goto LAB_0027ad92;
                  }
                  else {
                    lVar13 = 0;
                    do {
                      psVar14 = (short *)((long)puVar11 + lVar13);
                      if (*psVar14 == 0) {
                        if (*(short *)((long)&XMLUni::fgXMLNSString + lVar13) == 0)
                        goto LAB_0027ad29;
                        break;
                      }
                      psVar17 = (short *)((long)&XMLUni::fgXMLNSString + lVar13);
                      lVar13 = lVar13 + 2;
                    } while (*psVar14 == *psVar17);
                  }
                }
                goto LAB_0027ad9b;
              }
              this_00 = pDVar10;
              iVar5 = (*(code *)pDVar10->fContainingNode[2]._vptr_DOMNode)();
              psVar14 = (short *)CONCAT44(extraout_var_08,iVar5);
              if (psVar14 != &XMLUni::fgXMLNSString) {
                psVar17 = &XMLUni::fgXMLNSString;
                if (psVar14 == (short *)0x0) {
LAB_0027ad19:
                  if (*psVar17 == 0) goto LAB_0027ad92;
                }
                else {
                  psVar17 = &XMLUni::fgXMLNSString;
                  do {
                    sVar2 = *psVar14;
                    if (sVar2 == 0) goto LAB_0027ad19;
                    psVar14 = psVar14 + 1;
                    sVar3 = *psVar17;
                    psVar17 = psVar17 + 1;
                  } while (sVar2 == sVar3);
                }
                goto LAB_0027acad;
              }
LAB_0027ad92:
              bVar21 = false;
            }
            if (!bVar21) break;
            uVar19 = uVar19 + 1;
            bVar20 = uVar9 <= uVar19;
            pXVar7 = pXVar6;
          } while (uVar19 != uVar9);
        }
      }
      if (!bVar20) {
        return pXVar6;
      }
    }
    break;
  case 2:
    iVar5 = (*this->fOwnerNode->_vptr_DOMNode[4])();
    if (iVar5 != 1) {
      return (XMLCh *)0x0;
    }
    pDVar16 = this->fOwnerNode;
    goto LAB_0027adda;
  default:
    currentNode = (DOMNodeImpl *)this->fContainingNode;
    break;
  case 6:
  case 10:
  case 0xb:
  case 0xc:
    goto LAB_0027ab35;
  case 9:
    iVar5 = (*(code *)currentNode[-1].fContainingNode[0xd]._vptr_DOMNode)(currentNode + -1);
    pDVar16 = (DOMNode *)CONCAT44(extraout_var,iVar5);
    goto LAB_0027adda;
  }
  pDVar16 = getElementAncestor(this_00,(DOMNode *)currentNode);
  if (pDVar16 == (DOMNode *)0x0) {
LAB_0027ab35:
    return (XMLCh *)0x0;
  }
LAB_0027adda:
  iVar5 = (*pDVar16->_vptr_DOMNode[0x25])(pDVar16,specifiedPrefix);
  return (XMLCh *)CONCAT44(extraout_var_10,iVar5);
}

Assistant:

const XMLCh* DOMNodeImpl::lookupNamespaceURI(const XMLCh* specifiedPrefix) const  {
    const DOMNode *thisNode = getContainingNode();

    short type = thisNode->getNodeType();
    switch (type) {
    case DOMNode::ELEMENT_NODE : {
        const XMLCh* ns = thisNode->getNamespaceURI();
        const XMLCh* prefix = thisNode->getPrefix();
        if (ns != 0) {
            // REVISIT: is it possible that prefix is empty string?
            if (specifiedPrefix == 0 && prefix == specifiedPrefix) {
                // looking for default namespace
                return ns;
            } else if (prefix != 0 && XMLString::equals(prefix, specifiedPrefix)) {
                // non default namespace
                return ns;
            }
        }
        if (thisNode->hasAttributes()) {
            DOMNamedNodeMap *nodeMap = thisNode->getAttributes();
            if(nodeMap != 0) {
                XMLSize_t length = nodeMap->getLength();
                for (XMLSize_t i = 0;i < length;i++) {
                    DOMNode *attr = nodeMap->item(i);
                    const XMLCh *attrPrefix = attr->getPrefix();
                    const XMLCh *value = attr->getNodeValue();
                    ns = attr->getNamespaceURI();

                    if (ns != 0 && XMLString::equals(ns, XMLUni::fgXMLNSURIName)) {
                        // at this point we are dealing with DOM Level 2 nodes only
                        if (specifiedPrefix == 0 &&
                            XMLString::equals(attr->getNodeName(), XMLUni::fgXMLNSString)) {
                            // default namespace
                            return value;
                        } else if (attrPrefix != 0 &&
                                   XMLString::equals(attrPrefix, XMLUni::fgXMLNSString) &&
                                   XMLString::equals(attr->getLocalName(), specifiedPrefix)) {
                            // non default namespace
                            return value;
                        }
                    }
                }
            }
        }
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->lookupNamespaceURI(specifiedPrefix);
        }
        return 0;
    }
    case DOMNode::DOCUMENT_NODE : {
        return((DOMDocument*)thisNode)->getDocumentElement()->lookupNamespaceURI(specifiedPrefix);
    }
    case DOMNode::ENTITY_NODE :
    case DOMNode::NOTATION_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
        // type is unknown
        return 0;
    case DOMNode::ATTRIBUTE_NODE:{
        if (fOwnerNode->getNodeType() == DOMNode::ELEMENT_NODE) {
            return fOwnerNode->lookupNamespaceURI(specifiedPrefix);
        }
        return 0;
    }
    default:{
        DOMNode *ancestor = getElementAncestor(getContainingNode());
        if (ancestor != 0) {
            return ancestor->lookupNamespaceURI(specifiedPrefix);
        }
        return 0;
    }
    }
}